

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.h
# Opt level: O1

void __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::
~MelGeneralizedCepstrumToMelGeneralizedCepstrum
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this)

{
  pointer ppMVar1;
  
  this->_vptr_MelGeneralizedCepstrumToMelGeneralizedCepstrum =
       (_func_int **)&PTR__MelGeneralizedCepstrumToMelGeneralizedCepstrum_0011f4c8;
  ppMVar1 = (this->modules_).
            super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 !=
      (this->modules_).
      super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppMVar1 != (ModuleInterface *)0x0) {
        (*(*ppMVar1)->_vptr_ModuleInterface[1])();
      }
      ppMVar1 = ppMVar1 + 1;
    } while (ppMVar1 !=
             (this->modules_).
             super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppMVar1 = (this->modules_).
            super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 != (pointer)0x0) {
    operator_delete(ppMVar1);
    return;
  }
  return;
}

Assistant:

virtual ~MelGeneralizedCepstrumToMelGeneralizedCepstrum() {
    for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                         ModuleInterface*>::iterator itr(modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }